

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O1

ARKodeSPRKTable arkodeSymplecticRuth3(void)

{
  sunrealtype *psVar1;
  ARKodeSPRKTable pAVar2;
  
  pAVar2 = ARKodeSPRKTable_Alloc(3);
  if (pAVar2 == (ARKodeSPRKTable)0x0) {
    pAVar2 = (ARKodeSPRKTable)0x0;
  }
  else {
    pAVar2->q = 3;
    pAVar2->stages = 3;
    psVar1 = pAVar2->a;
    *psVar1 = 0.6666666666666666;
    psVar1[1] = -0.6666666666666666;
    psVar1[2] = 1.0;
    psVar1 = pAVar2->ahat;
    *psVar1 = 0.2916666666666667;
    psVar1[1] = 0.75;
    psVar1[2] = -0.041666666666666664;
  }
  return pAVar2;
}

Assistant:

static ARKodeSPRKTable arkodeSymplecticRuth3(void)
{
  ARKodeSPRKTable sprk_table = ARKodeSPRKTable_Alloc(3);
  if (!sprk_table) { return NULL; }
  sprk_table->q       = 3;
  sprk_table->stages  = 3;
  sprk_table->a[0]    = SUN_RCONST(2.0) / SUN_RCONST(3.0);
  sprk_table->a[1]    = -SUN_RCONST(2.0) / SUN_RCONST(3.0);
  sprk_table->a[2]    = SUN_RCONST(1.0);
  sprk_table->ahat[0] = SUN_RCONST(7.0) / SUN_RCONST(24.0);
  sprk_table->ahat[1] = SUN_RCONST(3.0) / SUN_RCONST(4.0);
  sprk_table->ahat[2] = -SUN_RCONST(1.0) / SUN_RCONST(24.0);
  return sprk_table;
}